

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_EndPolling
                  (PaAlsaStreamComponent *self,pollfd *pfds,int *shouldPoll,int *xrun)

{
  int iVar1;
  PaError PVar2;
  unsigned_short revents;
  ushort local_1a;
  
  iVar1 = snd_pcm_poll_descriptors_revents(self->pcm,pfds,self->nfds,&local_1a);
  if (iVar1 < 0) {
    PaAlsaStreamComponent_EndPolling_cold_1();
    PVar2 = -9999;
  }
  else if (local_1a == 0) {
    PVar2 = 0;
    if (self->useReventFix != 0) {
      self->ready = 1;
      *shouldPoll = 0;
      PVar2 = 0;
    }
  }
  else {
    if (((local_1a & 8) == 0) && ((local_1a & 0x10) == 0)) {
      self->ready = 1;
    }
    else {
      *xrun = 1;
    }
    *shouldPoll = 0;
    PVar2 = 0;
  }
  return PVar2;
}

Assistant:

static PaError PaAlsaStreamComponent_EndPolling( PaAlsaStreamComponent* self, struct pollfd* pfds, int* shouldPoll, int* xrun )
{
    PaError result = paNoError;
    unsigned short revents;

    ENSURE_( alsa_snd_pcm_poll_descriptors_revents( self->pcm, pfds, self->nfds, &revents ), paUnanticipatedHostError );
    if( revents != 0 )
    {
        if( revents & POLLERR )
        {
            *xrun = 1;
        }
        else if( revents & POLLHUP )
        {
            *xrun = 1;
            PA_DEBUG(( "%s: revents has POLLHUP, processing as XRUN\n", __FUNCTION__ ));
        }
        else
            self->ready = 1;

        *shouldPoll = 0;
    }
    else /* (A zero revent occurred) */
        /* Work around an issue with Alsa older than 1.0.16 using some plugins (eg default with plug + dmix) where
         * POLLIN or POLLOUT are zeroed by Alsa-lib if _mmap_avail() is a few frames short of avail_min at period
         * boundary, possibly due to erratic dma interrupts at period boundary?  Treat as a valid event.
         */
        if( self->useReventFix )
        {
            self->ready = 1;
            *shouldPoll = 0;
        }

error:
    return result;
}